

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O3

int luaB_select(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  int iVar5;
  
  iVar1 = lua_gettop(L);
  iVar2 = lua_type(L,1);
  if ((iVar2 == 4) && (pcVar3 = lua_tolstring(L,1,(size_t *)0x0), *pcVar3 == '#')) {
    lua_pushinteger(L,(long)(iVar1 + -1));
    return 1;
  }
  lVar4 = luaL_checkinteger(L,1);
  iVar2 = (int)lVar4;
  iVar5 = iVar2;
  if (iVar1 < iVar2) {
    iVar5 = iVar1;
  }
  if (iVar2 < 0) {
    iVar5 = iVar1 + iVar2;
  }
  if (iVar5 < 1) {
    luaL_argerror(L,1,"index out of range");
  }
  return iVar1 - iVar5;
}

Assistant:

static int luaB_select (lua_State *L) {
  int n = lua_gettop(L);
  if (lua_type(L, 1) == LUA_TSTRING && *lua_tostring(L, 1) == '#') {
    lua_pushinteger(L, n-1);
    return 1;
  }
  else {
    int i = luaL_checkint(L, 1);
    if (i < 0) i = n + i;
    else if (i > n) i = n;
    luaL_argcheck(L, 1 <= i, 1, "index out of range");
    return n - i;
  }
}